

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O0

unsigned_short ** Extra_TruthPerm43(void)

{
  unsigned_short uVar1;
  unsigned_short **ppuVar2;
  int local_1c;
  uint local_18;
  int k;
  int i;
  uint uTruth;
  unsigned_short **pTable;
  
  ppuVar2 = (unsigned_short **)Extra_ArrayAlloc(0x100,0x10,2);
  for (local_18 = 0; (int)local_18 < 0x100; local_18 = local_18 + 1) {
    for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
      uVar1 = Extra_TruthPerm4One(local_18 << 8 | local_18,local_1c);
      ppuVar2[(int)local_18][local_1c] = uVar1;
    }
  }
  return ppuVar2;
}

Assistant:

unsigned short ** Extra_TruthPerm43()
{
    unsigned short ** pTable;
    unsigned uTruth;
    int i, k;
    pTable = (unsigned short **)Extra_ArrayAlloc( 256, 16, 2 );
    for ( i = 0; i < 256; i++ )
    {
        uTruth = (i << 8) | i;
        for ( k = 0; k < 16; k++ )
            pTable[i][k] = Extra_TruthPerm4One( uTruth, k );
    }
    return pTable;
}